

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

quat quat_slerp(quat v0,quat v1,float a)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  quat qVar7;
  float local_88;
  float fStack_84;
  float local_78;
  float fStack_74;
  float local_58;
  float fStack_54;
  
  local_58 = v1.z;
  fStack_54 = v1.w;
  local_88 = v1.x;
  fStack_84 = v1.y;
  fVar3 = v0.z;
  fVar5 = v0.w;
  fVar4 = v0.x;
  fVar6 = v0.y;
  fVar1 = fVar3 * fVar3 + fVar6 * fVar6 + fVar5 * fVar5 + fVar4 * fVar4;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar4 = fVar4 / fVar1;
    fVar6 = fVar6 / fVar1;
    fVar3 = fVar3 / fVar1;
    fVar5 = fVar5 / fVar1;
  }
  fVar1 = local_58 * local_58 + fStack_84 * fStack_84 + fStack_54 * fStack_54 + local_88 * local_88;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    local_88 = local_88 / fVar1;
    fStack_84 = fStack_84 / fVar1;
    local_58 = local_58 / fVar1;
    fStack_54 = fStack_54 / fVar1;
  }
  fVar1 = fVar5 * fStack_54 + fVar3 * local_58 + fVar4 * local_88 + fVar6 * fStack_84;
  if (ABS(fVar1) <= 0.95) {
    if (fVar1 < 0.0) {
      local_88 = -local_88;
      fStack_84 = -fStack_84;
      local_58 = -local_58;
      fStack_54 = -fStack_54;
      fVar1 = -fVar1;
    }
    if (fVar1 <= -1.0) {
      fVar1 = -1.0;
    }
    if (1.0 <= fVar1) {
      fVar1 = 1.0;
    }
    fVar1 = acosf(fVar1);
    local_78 = local_88 - fVar4 * a;
    fStack_74 = fStack_84 - fVar6 * a;
    local_58 = local_58 - fVar3 * a;
    fStack_54 = fStack_54 - fVar5 * a;
    fVar2 = local_58 * local_58 +
            fStack_74 * fStack_74 + fStack_54 * fStack_54 + local_78 * local_78;
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      local_78 = local_78 / fVar2;
      fStack_74 = fStack_74 / fVar2;
      local_58 = local_58 / fVar2;
      fStack_54 = fStack_54 / fVar2;
    }
    fVar2 = cosf(fVar1 * a);
    fVar1 = sinf(fVar1 * a);
    fVar4 = local_78 * fVar1 + fVar4 * fVar2;
    fVar6 = fStack_74 * fVar1 + fVar6 * fVar2;
    fVar3 = local_58 * fVar1 + fVar3 * fVar2;
    fVar5 = fStack_54 * fVar1 + fVar2 * fVar5;
  }
  else {
    fVar4 = (local_88 - fVar4) * a + fVar4;
    fVar6 = (fStack_84 - fVar6) * a + fVar6;
    fVar3 = (local_58 - fVar3) * a + fVar3;
    fVar5 = (fStack_54 - fVar5) * a + fVar5;
  }
  qVar7.y = fVar6;
  qVar7.x = fVar4;
  qVar7.w = fVar5;
  qVar7.z = fVar3;
  return qVar7;
}

Assistant:

quat quat_slerp(quat v0, quat v1, float a) {
    v0 = quat_normalize(v0);
    v1 = quat_normalize(v1);

    float dot = quat_dot(v0, v1);
    if (fabs(dot) > 0.95f) {
        return quat_add(v0, quat_scale(quat_subtract(v1, v0), a));
    }

    if (dot < 0.0f) {
        v1 = quat_scale(v1, -1.0f);
        dot = -dot;
    }

    dot = fminf(fmaxf(-1.0f, dot), 1.0f);
    float theta_0 = acosf(dot);
    float theta = theta_0 * a;

    quat v2 = quat_subtract(v1, quat_scale(v0, a));
    v2 = quat_normalize(v2);

    return quat_add(quat_scale(v0, cosf(theta)), quat_scale(v2, sinf(theta)));
}